

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::SymlinkExecutable
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  int iVar2;
  string name;
  string realName;
  
  std::__cxx11::string::string
            ((string *)&realName,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string
            ((string *)&name,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3));
  bVar1 = std::operator!=(&name,&realName);
  iVar2 = 0;
  if (bVar1) {
    bVar1 = SymlinkInternal(&realName,&name);
    if (!bVar1) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_executable");
      iVar2 = 1;
    }
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&realName);
  return iVar2;
}

Assistant:

int cmcmd::SymlinkExecutable(std::vector<std::string>& args)
{
  int result = 0;
  std::string realName = args[2];
  std::string name = args[3];
  if(name != realName)
    {
    if(!cmcmd::SymlinkInternal(realName, name))
      {
      cmSystemTools::ReportLastSystemError("cmake_symlink_executable");
      result = 1;
      }
    }
  return result;
}